

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.cc
# Opt level: O0

void SplitVarnode::createBoolOp
               (Funcdata *data,PcodeOp *cbranch,SplitVarnode *in1,SplitVarnode *in2,OpCode opc)

{
  bool bVar1;
  Varnode *pVVar2;
  Address *pc;
  PcodeOp *op;
  Varnode *pVVar3;
  Varnode *newbool;
  PcodeOp *newop;
  Varnode *boolvn;
  PcodeOp *addrop;
  OpCode opc_local;
  SplitVarnode *in2_local;
  SplitVarnode *in1_local;
  PcodeOp *cbranch_local;
  Funcdata *data_local;
  
  pVVar2 = PcodeOp::getIn(cbranch,1);
  bVar1 = Varnode::isWritten(pVVar2);
  boolvn = (Varnode *)cbranch;
  if (bVar1) {
    boolvn = (Varnode *)Varnode::getDef(pVVar2);
  }
  findCreateWhole(in1,data);
  findCreateWhole(in2,data);
  pc = PcodeOp::getAddr((PcodeOp *)boolvn);
  op = Funcdata::newOp(data,2,pc);
  Funcdata::opSetOpcode(data,op,opc);
  pVVar2 = Funcdata::newUniqueOut(data,1,op);
  pVVar3 = getWhole(in1);
  Funcdata::opSetInput(data,op,pVVar3,0);
  pVVar3 = getWhole(in2);
  Funcdata::opSetInput(data,op,pVVar3,1);
  Funcdata::opInsertBefore(data,op,cbranch);
  Funcdata::opSetInput(data,cbranch,pVVar2,1);
  return;
}

Assistant:

void SplitVarnode::createBoolOp(Funcdata &data,PcodeOp *cbranch,SplitVarnode &in1,SplitVarnode &in2,
				OpCode opc)

{ // Create a new boolean op which replaces the boolean taken as input by -cbranch- with a double
  // precision version.
  PcodeOp *addrop = cbranch;
  Varnode *boolvn = cbranch->getIn(1);
  if (boolvn->isWritten())
    addrop = boolvn->getDef();	// Use the address of the comparison operator
  in1.findCreateWhole(data);
  in2.findCreateWhole(data);
  PcodeOp *newop = data.newOp(2,addrop->getAddr());
  data.opSetOpcode(newop,opc);
  Varnode *newbool = data.newUniqueOut(1,newop);
  data.opSetInput(newop,in1.getWhole(),0);
  data.opSetInput(newop,in2.getWhole(),1);
  data.opInsertBefore(newop,cbranch);
  data.opSetInput(cbranch,newbool,1); // CBRANCH now determined by new compare
}